

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O3

string * __thiscall
duckdb::DBConfig::SanitizeAllowedPath(string *__return_storage_ptr__,DBConfig *this,string *path)

{
  pointer pcVar1;
  int iVar2;
  pointer pFVar3;
  string path_sep;
  string local_78;
  string local_58;
  string local_38;
  
  pFVar3 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::operator->
                     (&this->file_system);
  (*pFVar3->_vptr_FileSystem[0x18])(&local_38,pFVar3,path);
  iVar2 = ::std::__cxx11::string::compare((char *)&local_38);
  if (iVar2 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (path->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + path->_M_string_length);
  }
  else {
    pcVar1 = (path->_M_dataplus)._M_p;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar1,pcVar1 + path->_M_string_length);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"/","");
    StringUtil::Replace(__return_storage_ptr__,&local_58,&local_38,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string DBConfig::SanitizeAllowedPath(const string &path) const {
	auto path_sep = file_system->PathSeparator(path);
	if (path_sep != "/") {
		// allowed_directories/allowed_path always uses forward slashes regardless of the OS
		return StringUtil::Replace(path, path_sep, "/");
	}
	return path;
}